

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmc_impl.cpp
# Opt level: O3

string * __thiscall
ui::(anonymous_namespace)::Format_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,float value,sizeApprox unit)

{
  long lVar1;
  long *plVar2;
  string *psVar3;
  size_type *psVar4;
  int iVar5;
  stringstream ss;
  long *local_1c0 [2];
  long local_1b0 [2];
  float local_19c;
  stringstream local_198 [16];
  long local_188;
  undefined8 local_180 [2];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  local_19c = value;
  std::__cxx11::stringstream::stringstream(local_198);
  *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) & 0xfffffefb | 4;
  iVar5 = (int)this;
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 2;
  std::ostream::_M_insert<double>((double)(local_19c / (float)((ulong)this & 0xffffffff)));
  if (iVar5 == 0x400) {
    std::__cxx11::stringbuf::str();
    plVar2 = (long *)std::__cxx11::string::append((char *)local_1c0);
  }
  else if (iVar5 == 0x100000) {
    std::__cxx11::stringbuf::str();
    plVar2 = (long *)std::__cxx11::string::append((char *)local_1c0);
  }
  else {
    if (iVar5 != 0x40000000) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_0011d6a1;
    }
    std::__cxx11::stringbuf::str();
    plVar2 = (long *)std::__cxx11::string::append((char *)local_1c0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
LAB_0011d6a1:
  std::__cxx11::stringstream::~stringstream(local_198);
  psVar3 = (string *)std::ios_base::~ios_base(local_118);
  return psVar3;
}

Assistant:

std::string Format(float value, sizeApprox unit) {
  std::stringstream ss;
  ss << std::fixed << std::setprecision(2) << (value / float(unit));

  switch (unit) {
    case KB:
      return ss.str() + " KB";
    case MB:
      return ss.str() + " MB";
    case GB:
      return ss.str() + " GB";
    default:
      return "";
  }
}